

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> * __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::replaceTerms
          (Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *__return_storage_ptr__,
          Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,PolyNf *simplifiedTerms)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar2;
  int iVar3;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar4;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_d8;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_b0;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_90;
  RationalConstantType local_80;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_60;
  
  local_d8._cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_d8._end = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_d8._capacity = 0;
  local_d8._stack = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::reserve
            (&local_d8,
             ((long)(this->_summands)._cursor - (long)(this->_summands)._stack) / 0x30 & 0xffffffff)
  ;
  pMVar1 = (this->_summands)._cursor;
  iVar3 = 0;
  for (pMVar4 = (this->_summands)._stack; pMVar4 != pMVar1; pMVar4 = pMVar4 + 1) {
    RationalConstantType::RationalConstantType(&local_80,&pMVar4->numeral);
    MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::replaceTerms
              ((MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_b0,
               (pMVar4->factors)._ptr,simplifiedTerms + iVar3);
    Lib::
    perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>
              ((Lib *)&local_90,
               (MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_b0);
    Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom(&local_60,&local_80,&local_90);
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::push
              (&local_d8,&local_60);
    RationalConstantType::~RationalConstantType(&local_60.numeral);
    Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
              (&local_b0);
    RationalConstantType::~RationalConstantType(&local_80);
    pMVar2 = (pMVar4->factors)._ptr;
    iVar3 = iVar3 + (int)(((long)(pMVar2->_factors)._cursor - (long)(pMVar2->_factors)._stack) /
                         0x1c);
  }
  Polynom(__return_storage_ptr__,&local_d8);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

Polynom<Number> Polynom<Number>::replaceTerms(PolyNf* simplifiedTerms) const 
{
  int offs = 0;
  Stack<Monom> out;
  out.reserve(nSummands());

  for (auto& monom : _summands) {
    out.push(Monom(
          monom.numeral, 
          perfect(monom.factors->replaceTerms(&simplifiedTerms[offs]))));
    offs += monom.factors->nFactors();
  }
  return Polynom(std::move(out));
}